

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O0

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownOrClause
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  ulong uVar1;
  idx_t iVar2;
  ExpressionClass EVar3;
  ExpressionType EVar4;
  bool bVar5;
  size_type sVar6;
  pointer pEVar7;
  BoundColumnRefExpression *pBVar8;
  BoundConstantExpression *pBVar9;
  const_reference this_00;
  idx_t iVar10;
  pointer pCVar11;
  BaseExpression *in_RCX;
  templated_unique_single_t optional_filter;
  templated_unique_single_t const_filter;
  templated_unique_single_t null_filter_1;
  templated_unique_single_t null_filter;
  ExpressionType comparison_type;
  value_type *col_id;
  bool invert;
  BoundComparisonExpression *comp;
  optional_ptr<duckdb::BoundConstantExpression,_true> const_val;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> column_ref;
  value_type *child;
  idx_t i;
  idx_t column_id;
  templated_unique_single_t conj_filter;
  BoundConjunctionExpression *conj;
  unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>_>
  *in_stack_fffffffffffffd58;
  ColumnIndex *in_stack_fffffffffffffd60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_fffffffffffffd70;
  BaseExpression *in_stack_fffffffffffffda0;
  Value *in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  undefined6 in_stack_fffffffffffffdd0;
  ExpressionType in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  BoundConstantExpression *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  ExpressionType in_stack_fffffffffffffde4;
  ExpressionType in_stack_fffffffffffffde5;
  ExpressionType in_stack_fffffffffffffde6;
  ExpressionType in_stack_fffffffffffffde7;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> local_120 [11];
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  optional_ptr<duckdb::BoundConstantExpression,_true> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  byte local_81;
  BoundComparisonExpression *local_80;
  optional_ptr<duckdb::BoundConstantExpression,_true> local_78;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> local_70 [3];
  reference local_58;
  ulong local_50;
  idx_t local_48;
  undefined4 local_3c;
  BoundConjunctionExpression *local_30;
  FilterPushdownResult local_4;
  
  EVar3 = BaseExpression::GetExpressionClass(in_RCX);
  if (EVar3 == BOUND_CONJUNCTION) {
    local_30 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(in_stack_fffffffffffffda0);
    EVar4 = BaseExpression::GetExpressionType((BaseExpression *)local_30);
    if (EVar4 == CONJUNCTION_OR) {
      make_uniq<duckdb::ConjunctionOrFilter>();
      bVar5 = std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::empty(in_stack_fffffffffffffd70);
      if (bVar5) {
        local_4 = NO_PUSHDOWN;
        local_3c = 1;
      }
      else {
        local_48 = 0;
        for (local_50 = 0; uVar1 = local_50,
            sVar6 = ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            *)&local_30->children), uVar1 < sVar6; local_50 = local_50 + 1) {
          local_58 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                   *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58)
          ;
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)in_stack_fffffffffffffd60);
          EVar3 = BaseExpression::GetExpressionClass(&pEVar7->super_BaseExpression);
          if (EVar3 != BOUND_COMPARISON) {
            local_4 = NO_PUSHDOWN;
            local_3c = 1;
            goto LAB_00d0aa06;
          }
          optional_ptr<duckdb::BoundColumnRefExpression,_true>::optional_ptr(local_70);
          optional_ptr<duckdb::BoundConstantExpression,_true>::optional_ptr(&local_78);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd60);
          local_80 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                               (in_stack_fffffffffffffda0);
          local_81 = 0;
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)in_stack_fffffffffffffd60);
          EVar3 = BaseExpression::GetExpressionClass(&pEVar7->super_BaseExpression);
          if (EVar3 != BOUND_COLUMN_REF) {
LAB_00d0a290:
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)in_stack_fffffffffffffd60);
            EVar3 = BaseExpression::GetExpressionClass(&pEVar7->super_BaseExpression);
            if (EVar3 == BOUND_CONSTANT) {
              pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                     *)in_stack_fffffffffffffd60);
              EVar3 = BaseExpression::GetExpressionClass(&pEVar7->super_BaseExpression);
              if (EVar3 == BOUND_COLUMN_REF) {
                unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)in_stack_fffffffffffffd60);
                pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                   (in_stack_fffffffffffffda0);
                optional_ptr<duckdb::BoundColumnRefExpression,_true>::optional_ptr
                          ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)(local_a8 + 8),
                           pBVar8);
                local_70[0].ptr = (BoundColumnRefExpression *)local_a8._8_8_;
                unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)in_stack_fffffffffffffd60);
                pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                   (in_stack_fffffffffffffda0);
                optional_ptr<duckdb::BoundConstantExpression,_true>::optional_ptr
                          ((optional_ptr<duckdb::BoundConstantExpression,_true> *)local_a8,pBVar9);
                local_78.ptr = (BoundConstantExpression *)local_a8._0_8_;
                local_81 = 1;
                goto LAB_00d0a3e9;
              }
            }
            local_4 = NO_PUSHDOWN;
            local_3c = 1;
            goto LAB_00d0aa06;
          }
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)in_stack_fffffffffffffd60);
          EVar3 = BaseExpression::GetExpressionClass(&pEVar7->super_BaseExpression);
          if (EVar3 != BOUND_CONSTANT) goto LAB_00d0a290;
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd60);
          pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(in_stack_fffffffffffffda0)
          ;
          optional_ptr<duckdb::BoundColumnRefExpression,_true>::optional_ptr
                    ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)&local_90,pBVar8);
          local_70[0].ptr = (BoundColumnRefExpression *)local_90._M_pi;
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd60);
          pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>(in_stack_fffffffffffffda0);
          optional_ptr<duckdb::BoundConstantExpression,_true>::optional_ptr(&local_98,pBVar9);
          local_78.ptr = local_98.ptr;
LAB_00d0a3e9:
          iVar2 = local_48;
          if (local_50 == 0) {
            optional_ptr<duckdb::BoundColumnRefExpression,_true>::operator->
                      ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)
                       in_stack_fffffffffffffd60);
            local_c8._24_8_ =
                 vector<duckdb::ColumnIndex,_true>::operator[]
                           ((vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffffd60,
                            (size_type)in_stack_fffffffffffffd58);
            local_48 = ColumnIndex::GetPrimaryIndex((ColumnIndex *)local_c8._24_8_);
          }
          else {
            optional_ptr<duckdb::BoundColumnRefExpression,_true>::operator->
                      ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)
                       in_stack_fffffffffffffd60);
            this_00 = vector<duckdb::ColumnIndex,_true>::operator[]
                                ((vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffffd60,
                                 (size_type)in_stack_fffffffffffffd58);
            iVar10 = ColumnIndex::GetPrimaryIndex(this_00);
            if (iVar2 != iVar10) {
              local_4 = NO_PUSHDOWN;
              local_3c = 1;
              goto LAB_00d0aa06;
            }
          }
          if ((local_81 & 1) == 0) {
            in_stack_fffffffffffffde4 =
                 BaseExpression::GetExpressionType((BaseExpression *)local_80);
            in_stack_fffffffffffffde5 = in_stack_fffffffffffffde4;
          }
          else {
            in_stack_fffffffffffffde7 =
                 BaseExpression::GetExpressionType((BaseExpression *)local_80);
            in_stack_fffffffffffffde6 =
                 FlipComparisonExpression
                           ((ExpressionType)((ulong)in_stack_fffffffffffffda0 >> 0x38));
            in_stack_fffffffffffffde5 = in_stack_fffffffffffffde6;
          }
          local_c8[0x17] = in_stack_fffffffffffffde5;
          in_stack_fffffffffffffdd8 =
               optional_ptr<duckdb::BoundConstantExpression,_true>::operator->
                         ((optional_ptr<duckdb::BoundConstantExpression,_true> *)
                          in_stack_fffffffffffffd60);
          in_stack_fffffffffffffdd7 = Value::IsNull(&in_stack_fffffffffffffdd8->value);
          if ((bool)in_stack_fffffffffffffdd7) {
            in_stack_fffffffffffffdd6 = local_c8[0x17];
            if (local_c8[0x17] == COMPARE_DISTINCT_FROM) {
              make_uniq<duckdb::IsNotNullFilter>();
              in_stack_fffffffffffffdc8 =
                   unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                   ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                 *)in_stack_fffffffffffffd60);
              in_stack_fffffffffffffdc0 = (Value *)local_c8;
              unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>::
              unique_ptr<duckdb::IsNotNullFilter,std::default_delete<std::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>>>,void>
                        ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)in_stack_fffffffffffffd60,
                         (unique_ptr<duckdb::IsNotNullFilter,_std::default_delete<duckdb::IsNotNullFilter>_>
                          *)in_stack_fffffffffffffd58);
              ::std::
              vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ::push_back((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                           *)in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
              unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              ~unique_ptr((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)0xd0a663);
              local_3c = 5;
              unique_ptr<duckdb::IsNotNullFilter,_std::default_delete<duckdb::IsNotNullFilter>,_true>
              ::~unique_ptr((unique_ptr<duckdb::IsNotNullFilter,_std::default_delete<duckdb::IsNotNullFilter>,_true>
                             *)0xd0a67b);
            }
            else if (local_c8[0x17] == COMPARE_BOUNDARY_END) {
              make_uniq<duckdb::IsNullFilter>();
              pCVar11 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                        ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                      *)in_stack_fffffffffffffd60);
              in_stack_fffffffffffffda0 =
                   (BaseExpression *)&(pCVar11->super_ConjunctionFilter).child_filters;
              unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>::
              unique_ptr<duckdb::IsNullFilter,std::default_delete<std::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>>>,void>
                        ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)in_stack_fffffffffffffd60,
                         (unique_ptr<duckdb::IsNullFilter,_std::default_delete<duckdb::IsNullFilter>_>
                          *)in_stack_fffffffffffffd58);
              ::std::
              vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ::push_back((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                           *)in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
              unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              ~unique_ptr((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)0xd0a732);
              local_3c = 5;
              unique_ptr<duckdb::IsNullFilter,_std::default_delete<duckdb::IsNullFilter>,_true>::
              ~unique_ptr((unique_ptr<duckdb::IsNullFilter,_std::default_delete<duckdb::IsNullFilter>,_true>
                           *)0xd0a74a);
            }
          }
          else {
            optional_ptr<duckdb::BoundConstantExpression,_true>::operator->
                      ((optional_ptr<duckdb::BoundConstantExpression,_true> *)
                       in_stack_fffffffffffffd60);
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType&,duckdb::Value&>
                      ((ExpressionType *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
            unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
            ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                          *)in_stack_fffffffffffffd60);
            unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>::
            unique_ptr<duckdb::ConstantFilter,std::default_delete<std::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>>>,void>
                      ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)in_stack_fffffffffffffd60,
                       (unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
                        *)in_stack_fffffffffffffd58);
            ::std::
            vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            ::push_back((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                         *)in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
            unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
            ~unique_ptr((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                         *)0xd0a82a);
            unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>::
            ~unique_ptr((unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
                         *)0xd0a837);
          }
        }
        make_uniq<duckdb::OptionalFilter>();
        unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>::
        unique_ptr<duckdb::ConjunctionOrFilter,std::default_delete<std::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>>>,void>
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>::
        operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                    *)in_stack_fffffffffffffd60);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::operator=
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffd60,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffd58);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)0xd0a8fa);
        ColumnIndex::ColumnIndex(in_stack_fffffffffffffd60,(idx_t)in_stack_fffffffffffffd58);
        unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>::
        unique_ptr<duckdb::OptionalFilter,std::default_delete<std::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>>>,void>
                  (local_120,
                   (unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>_>
                    *)in_stack_fffffffffffffd58);
        TableFilterSet::PushFilter
                  ((TableFilterSet *)
                   CONCAT17(in_stack_fffffffffffffde7,
                            CONCAT16(in_stack_fffffffffffffde6,
                                     CONCAT15(in_stack_fffffffffffffde5,
                                              CONCAT14(in_stack_fffffffffffffde4,
                                                       in_stack_fffffffffffffde0)))),
                   (ColumnIndex *)in_stack_fffffffffffffdd8,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)CONCAT17(in_stack_fffffffffffffdd7,
                               CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)0xd0a95e);
        ColumnIndex::~ColumnIndex((ColumnIndex *)0xd0a96b);
        local_4 = PUSHED_DOWN_PARTIALLY;
        local_3c = 1;
        unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>::
        ~unique_ptr((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                     *)0xd0a98e);
      }
LAB_00d0aa06:
      unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
      ::~unique_ptr((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                     *)0xd0aa13);
    }
    else {
      local_4 = NO_PUSHDOWN;
    }
  }
  else {
    local_4 = NO_PUSHDOWN;
  }
  return local_4;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownOrClause(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_CONJUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &conj = expr.Cast<BoundConjunctionExpression>();
	if (conj.GetExpressionType() != ExpressionType::CONJUNCTION_OR) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto conj_filter = make_uniq<ConjunctionOrFilter>();
	if (conj.children.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	idx_t column_id = 0;
	for (idx_t i = 0; i < conj.children.size(); i++) {
		auto &child = conj.children[i];
		if (child->GetExpressionClass() != ExpressionClass::BOUND_COMPARISON) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
		optional_ptr<BoundColumnRefExpression> column_ref;
		optional_ptr<BoundConstantExpression> const_val;
		auto &comp = child->Cast<BoundComparisonExpression>();
		bool invert = false;
		if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF &&
		    comp.right->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
			column_ref = comp.left->Cast<BoundColumnRefExpression>();
			const_val = comp.right->Cast<BoundConstantExpression>();
		} else if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT &&
		           comp.right->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
			column_ref = comp.right->Cast<BoundColumnRefExpression>();
			const_val = comp.left->Cast<BoundConstantExpression>();
			invert = true;
		} else {
			// child of OR filter is not simple so we do not push the or filter down at all
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		if (i == 0) {
			auto &col_id = column_ids[column_ref->binding.column_index];
			column_id = col_id.GetPrimaryIndex();
		} else if (column_id != column_ids[column_ref->binding.column_index].GetPrimaryIndex()) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		auto comparison_type = invert ? FlipComparisonExpression(comp.GetExpressionType()) : comp.GetExpressionType();
		if (const_val->value.IsNull()) {
			switch (comparison_type) {
			case ExpressionType::COMPARE_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNotNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			case ExpressionType::COMPARE_NOT_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			default:
				// if any other comparison type (i.e EQUAL, NOT_EQUAL) do not push a table filter - this is a nop
				// since x = NULL is always falsey, and this is a chain of OR conditions, we can just ignore it
				break;
			}
		} else {
			auto const_filter = make_uniq<ConstantFilter>(comparison_type, const_val->value);
			conj_filter->child_filters.push_back(std::move(const_filter));
		}
	}
	auto optional_filter = make_uniq<OptionalFilter>();
	optional_filter->child_filter = std::move(conj_filter);
	table_filters.PushFilter(ColumnIndex(column_id), std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}